

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inspect.c
# Opt level: O2

void duckdb_je_inspect_extent_util_stats_get
               (tsdn_t *tsdn,void *ptr,size_t *nfree,size_t *nregs,size_t *size)

{
  ulong uVar1;
  rtree_t *rtree;
  size_t *psVar2;
  rtree_contents_t local_1c8;
  rtree_ctx_t rtree_ctx_fallback;
  
  psVar2 = size;
  if (tsdn == (tsdn_t *)0x0) {
    rtree = (rtree_t *)&rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
  }
  else {
    rtree = (rtree_t *)&(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rtree_read(&local_1c8,tsdn,rtree,(rtree_ctx_t *)ptr,(uintptr_t)psVar2);
  if (local_1c8.edata == (edata_t *)0x0) {
    *size = 0;
    *nregs = 0;
    *nfree = 0;
  }
  else {
    *size = ((local_1c8.edata)->field_2).e_size_esn & 0xfffffffffffff000;
    if (((uint)(local_1c8.edata)->e_bits >> 0xc & 1) == 0) {
      *nfree = 0;
      uVar1 = 1;
    }
    else {
      *nfree = (ulong)((uint)((local_1c8.edata)->e_bits >> 0x1c) & 0x3ff);
      uVar1 = (ulong)duckdb_je_bin_infos[(uint)(local_1c8.edata)->e_bits >> 0x14 & 0xff].nregs;
    }
    *nregs = uVar1;
  }
  return;
}

Assistant:

void
inspect_extent_util_stats_get(tsdn_t *tsdn, const void *ptr, size_t *nfree,
    size_t *nregs, size_t *size) {
	assert(ptr != NULL && nfree != NULL && nregs != NULL && size != NULL);

	const edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	if (unlikely(edata == NULL)) {
		*nfree = *nregs = *size = 0;
		return;
	}

	*size = edata_size_get(edata);
	if (!edata_slab_get(edata)) {
		*nfree = 0;
		*nregs = 1;
	} else {
		*nfree = edata_nfree_get(edata);
		*nregs = bin_infos[edata_szind_get(edata)].nregs;
		assert(*nfree <= *nregs);
		assert(*nfree * edata_usize_get(edata) <= *size);
	}
}